

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  size_type sVar2;
  bool bVar3;
  char *pcVar4;
  int i;
  int index;
  uint index_00;
  char *in_R9;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> alloc;
  TypeParam ht3;
  hasher hasher;
  TypeParam ht1;
  TypeParam ht2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_220;
  AssertHelper local_218;
  undefined8 *local_210;
  AssertHelper local_208;
  string local_200;
  allocator_type local_1e0;
  undefined1 local_1d0 [8];
  int *local_1c8;
  char local_1c0 [112];
  pointer local_150;
  hasher local_144;
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_138;
  undefined1 local_b0 [8];
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_a8;
  
  local_1d0 = (undefined1  [8])0x0;
  local_1c8 = (int *)((ulong)local_1c8 & 0xffffffff00000000);
  local_200._M_dataplus._M_p = (pointer)0x0;
  local_200._M_string_length = local_200._M_string_length & 0xffffffff00000000;
  local_b0 = (undefined1  [8])((ulong)local_b0 & 0xffffffff00000000);
  local_a8.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.super_Hasher
  ._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (&local_138,0,(hasher *)local_1d0,(key_equal *)&local_200,(allocator_type *)local_b0);
  local_200._M_dataplus._M_p = (pointer)0x0;
  local_200._M_string_length = local_200._M_string_length & 0xffffffff00000000;
  local_1e0._0_8_ = (long *)0x0;
  local_1e0.count_ = (int *)((ulong)local_1e0.count_._4_4_ << 0x20);
  local_1d0 = (undefined1  [8])((ulong)local_1d0 & 0xffffffff00000000);
  local_1c8 = (int *)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_b0,0,(hasher *)&local_200,(key_equal *)&local_1e0,(allocator_type *)local_1d0)
  ;
  this_00 = &local_138.
             super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_200._M_dataplus._M_p._0_1_ = bVar3;
  local_200._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d0,(internal *)&local_200,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42e,(char *)local_1d0);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_1d0 != (undefined1  [8])local_1c0) {
      operator_delete((void *)local_1d0);
    }
    if ((long *)local_1e0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e0._0_8_ + 8))();
    }
  }
  sVar2 = local_200._M_string_length;
  if ((undefined8 *)local_200._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_200._M_string_length !=
        (undefined8 *)(local_200._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_200._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_200._M_dataplus._M_p._0_1_ = bVar3;
  local_200._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d0,(internal *)&local_200,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42f,(char *)local_1d0);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_1d0 != (undefined1  [8])local_1c0) {
      operator_delete((void *)local_1d0);
    }
    if ((long *)local_1e0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e0._0_8_ + 8))();
    }
  }
  sVar2 = local_200._M_string_length;
  if ((undefined8 *)local_200._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_200._M_string_length !=
        (undefined8 *)(local_200._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_200._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  pcVar4 = UniqueObjectHelper<char_const*>(1);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  local_138.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_138.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.key_info.delkey = pcVar4;
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_200._M_dataplus._M_p._0_1_ = bVar3;
  local_200._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d0,(internal *)&local_200,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x432,(char *)local_1d0);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_1d0 != (undefined1  [8])local_1c0) {
      operator_delete((void *)local_1d0);
    }
    if ((long *)local_1e0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e0._0_8_ + 8))();
    }
  }
  sVar2 = local_200._M_string_length;
  if ((undefined8 *)local_200._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_200._M_string_length !=
        (undefined8 *)(local_200._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_200._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_200._M_dataplus._M_p._0_1_ = bVar3;
  local_200._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d0,(internal *)&local_200,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x433,(char *)local_1d0);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_1d0 != (undefined1  [8])local_1c0) {
      operator_delete((void *)local_1d0);
    }
    if ((long *)local_1e0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e0._0_8_ + 8))();
    }
  }
  sVar2 = local_200._M_string_length;
  if ((undefined8 *)local_200._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_200._M_string_length !=
        (undefined8 *)(local_200._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_200._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize(&this_00->rep,2000);
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_200._M_dataplus._M_p._0_1_ = bVar3;
  local_200._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d0,(internal *)&local_200,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x435,(char *)local_1d0);
    testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if (local_1d0 != (undefined1  [8])local_1c0) {
      operator_delete((void *)local_1d0);
    }
    if ((long *)local_1e0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e0._0_8_ + 8))();
    }
  }
  sVar2 = local_200._M_string_length;
  if ((undefined8 *)local_200._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_200._M_string_length !=
        (undefined8 *)(local_200._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_200._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_144.id_ = 1;
  local_144.num_hashes_ = 0;
  local_144.num_compares_ = 0;
  local_1e0.id_ = 2;
  local_1e0.count_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)local_1d0,5,&local_144,&local_144,&local_1e0);
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,
                       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                        *)&local_1c8);
  local_218.data_._0_1_ = bVar3;
  local_210 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_200,(internal *)&local_218,(AssertionResult *)"ht1 == ht3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43b,local_200._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if (local_220._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_220._M_head_impl + 8))();
    }
  }
  puVar1 = local_210;
  if (local_210 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_210 != local_210 + 2) {
      operator_delete((undefined8 *)*local_210);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,
                       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                        *)&local_1c8);
  local_218.data_._0_1_ = bVar3;
  local_210 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_200,(internal *)&local_218,(AssertionResult *)"ht1 != ht3","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43c,local_200._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if (local_220._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_220._M_head_impl + 8))();
    }
  }
  puVar1 = local_210;
  if (local_210 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_210 != local_210 + 2) {
      operator_delete((undefined8 *)*local_210);
    }
    operator_delete(puVar1);
  }
  local_218.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(2);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<char_const*const&,char_const*const&>
            ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)&local_200,
             (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)this_00,(char **)&local_218,(char **)&local_218);
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_218.data_._0_1_ = !bVar3;
  local_210 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_200,(internal *)&local_218,(AssertionResult *)"ht1 != ht2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43f,local_200._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if (local_220._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_220._M_head_impl + 8))();
    }
  }
  puVar1 = local_210;
  if (local_210 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_210 != local_210 + 2) {
      operator_delete((undefined8 *)*local_210);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_218.data_._0_1_ = !bVar3;
  local_210 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_200,(internal *)&local_218,(AssertionResult *)"ht1 == ht2","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x440,local_200._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if (local_220._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_220._M_head_impl + 8))();
    }
  }
  puVar1 = local_210;
  if (local_210 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_210 != local_210 + 2) {
      operator_delete((undefined8 *)*local_210);
    }
    operator_delete(puVar1);
  }
  local_218.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(2);
  google::
  dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_a8,1);
  google::
  dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<char_const*const&,char_const*const&>
            ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)&local_200,
             (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
              *)&local_a8,(char **)&local_218,(char **)&local_218);
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_218.data_._0_1_ = bVar3;
  local_210 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_200,(internal *)&local_218,(AssertionResult *)"ht1 == ht2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x443,local_200._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if (local_220._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_220._M_head_impl + 8))();
    }
  }
  puVar1 = local_210;
  if (local_210 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_210 != local_210 + 2) {
      operator_delete((undefined8 *)*local_210);
    }
    operator_delete(puVar1);
  }
  index = 3;
  do {
    local_218.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(index);
    google::
    dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<char_const*const&,char_const*const&>
              ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)&local_200,
               (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                *)this_00,(char **)&local_218,(char **)&local_218);
    index = index + 1;
  } while (index != 0x7d1);
  index_00 = 0x7d1;
  do {
    index_00 = index_00 - 1;
    local_218.data_ = (AssertHelperData *)UniqueObjectHelper<char_const*>(index_00);
    google::
    dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&local_a8,1);
    google::
    dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<char_const*const&,char_const*const&>
              ((pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)&local_200,
               (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                *)&local_a8,(char **)&local_218,(char **)&local_218);
  } while (3 < index_00);
  bVar3 = google::
          dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a8);
  local_218.data_._0_1_ = bVar3;
  local_210 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_200,(internal *)&local_218,(AssertionResult *)"ht1 == ht2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,1099,local_200._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if (local_220._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_220._M_head_impl + 8))();
    }
  }
  puVar1 = local_210;
  if (local_210 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_210 != local_210 + 2) {
      operator_delete((undefined8 *)*local_210);
    }
    operator_delete(puVar1);
  }
  local_1d0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c265b8;
  if (local_150 != (pointer)0x0) {
    free(local_150);
  }
  local_b0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c265b8;
  if (local_a8.table != (pointer)0x0) {
    free(local_a8.table);
  }
  local_138.
  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c265b8;
  if (local_138.
      super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.table != (pointer)0x0) {
    free(local_138.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}